

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::StreamingReporterBase::sectionStarting(StreamingReporterBase *this,SectionInfo *_sectionInfo)

{
  Ptr<Catch::ThreadedSectionInfo> *this_00;
  ThreadedSectionInfo *pTVar1;
  Ptr<Catch::ThreadedSectionInfo> sectionInfo;
  value_type local_20;
  
  pTVar1 = (ThreadedSectionInfo *)operator_new(0x98);
  ThreadedSectionInfo::ThreadedSectionInfo(pTVar1,_sectionInfo,(ThreadedSectionInfo *)0x0);
  local_20.m_p = pTVar1;
  (*(pTVar1->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable[2])
            (pTVar1);
  this_00 = &this->currentSectionInfo;
  pTVar1 = (this->currentSectionInfo).m_p;
  if (pTVar1 == (ThreadedSectionInfo *)0x0) {
    Ptr<Catch::ThreadedSectionInfo>::operator=(this_00,&local_20);
    std::
    vector<Catch::Ptr<Catch::ThreadedSectionInfo>,_std::allocator<Catch::Ptr<Catch::ThreadedSectionInfo>_>_>
    ::push_back(&this->m_rootSections,this_00);
  }
  else {
    std::
    vector<Catch::Ptr<Catch::ThreadedSectionInfo>,_std::allocator<Catch::Ptr<Catch::ThreadedSectionInfo>_>_>
    ::push_back(&pTVar1->children,&local_20);
    (local_20.m_p)->parent = this_00->m_p;
    Ptr<Catch::ThreadedSectionInfo>::operator=(this_00,&local_20);
  }
  if (local_20.m_p != (ThreadedSectionInfo *)0x0) {
    (*((local_20.m_p)->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
      _vptr_NonCopyable[3])();
  }
  return;
}

Assistant:

virtual void sectionStarting( SectionInfo const& _sectionInfo ) {
            Ptr<ThreadedSectionInfo> sectionInfo = new ThreadedSectionInfo( _sectionInfo );
            if( !currentSectionInfo ) {
                currentSectionInfo = sectionInfo;
                m_rootSections.push_back( currentSectionInfo );
            }
            else {
                currentSectionInfo->children.push_back( sectionInfo );
                sectionInfo->parent = currentSectionInfo.get();
                currentSectionInfo = sectionInfo;
            }
        }